

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdaux.cpp
# Opt level: O3

void sqstd_printcallstack(HSQUIRRELVM v)

{
  int iVar1;
  code *pcVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  char *pcVar6;
  long lVar7;
  SQFloat f;
  SQBool bval;
  SQChar *s;
  SQInteger i;
  SQStackInfos si;
  float local_64;
  long local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  undefined8 local_38;
  
  pcVar2 = (code *)sq_geterrorfunc();
  if (pcVar2 != (code *)0x0) {
    (*pcVar2)(v,"\nCALLSTACK\n");
    lVar3 = sq_stackinfos(v,1,&local_48);
    if (-1 < lVar3) {
      lVar3 = 2;
      do {
        pcVar6 = local_48;
        if (local_48 == (char *)0x0) {
          pcVar6 = "unknown";
        }
        pcVar5 = local_40;
        if (local_40 == (char *)0x0) {
          pcVar5 = "unknown";
        }
        (*pcVar2)(v,"*FUNCTION [%s()] %s line [%d]\n",pcVar6,pcVar5,local_38);
        lVar4 = sq_stackinfos(v,lVar3,&local_48);
        lVar3 = lVar3 + 1;
      } while (-1 < lVar4);
    }
    (*pcVar2)(v,"\nLOCALS\n");
    lVar3 = 0;
    do {
      lVar4 = sq_getlocal(v,lVar3,0);
      if (lVar4 != 0) {
        lVar7 = 1;
        do {
          iVar1 = sq_gettype(v,0xffffffffffffffff);
          if (0x80001ff < iVar1) {
            if (iVar1 < 0x8010000) {
              if (iVar1 < 0x8001000) {
                if (iVar1 == 0x8000200) {
                  pcVar6 = "[%s] NATIVECLOSURE\n";
                }
                else {
                  if (iVar1 != 0x8000400) goto LAB_00105c2e;
                  pcVar6 = "[%s] GENERATOR\n";
                }
              }
              else if (iVar1 == 0x8001000) {
                pcVar6 = "[%s] THREAD\n";
              }
              else {
                if (iVar1 != 0x8004000) goto LAB_00105c2e;
                pcVar6 = "[%s] CLASS\n";
              }
            }
            else if (iVar1 < 0xa000080) {
              if (iVar1 == 0x8010000) {
                pcVar6 = "[%s] WEAKREF\n";
              }
              else {
                if (iVar1 != 0xa000020) goto LAB_00105c2e;
                pcVar6 = "[%s] TABLE\n";
              }
            }
            else if (iVar1 == 0xa000080) {
              pcVar6 = "[%s] USERDATA\n";
            }
            else {
              if (iVar1 != 0xa008000) goto LAB_00105c2e;
              pcVar6 = "[%s] INSTANCE\n";
            }
            goto LAB_00105c26;
          }
          if (iVar1 < 0x5000004) {
            if (iVar1 < 0x1000008) {
              if (iVar1 == 0x800) {
                pcVar6 = "[%s] USERPOINTER\n";
              }
              else {
                if (iVar1 != 0x1000001) goto LAB_00105c2e;
                pcVar6 = "[%s] NULL\n";
              }
LAB_00105c26:
              (*pcVar2)(v,pcVar6,lVar4);
            }
            else {
              if (iVar1 == 0x1000008) {
                sq_getbool(v,0xffffffffffffffff,&local_60);
                pcVar6 = "false";
                if (local_60 == 1) {
                  pcVar6 = "true";
                }
                pcVar5 = "[%s] %s\n";
              }
              else {
                if (iVar1 != 0x5000002) goto LAB_00105c2e;
                sq_getinteger(v,0xffffffffffffffff,&local_50);
                pcVar5 = "[%s] %d\n";
                pcVar6 = local_50;
              }
LAB_00105bfa:
              (*pcVar2)(v,pcVar5,lVar4,pcVar6);
            }
          }
          else {
            if (0x800003f < iVar1) {
              if (iVar1 == 0x8000040) {
                pcVar6 = "[%s] ARRAY\n";
              }
              else {
                if (iVar1 != 0x8000100) goto LAB_00105c2e;
                pcVar6 = "[%s] CLOSURE\n";
              }
              goto LAB_00105c26;
            }
            if (iVar1 == 0x5000004) {
              sq_getfloat(v,0xffffffffffffffff,&local_64);
              (*pcVar2)((double)local_64,v,"[%s] %.14g\n",lVar4);
            }
            else if (iVar1 == 0x8000010) {
              sq_getstring(v,0xffffffffffffffff,&local_58);
              pcVar5 = "[%s] \"%s\"\n";
              pcVar6 = local_58;
              goto LAB_00105bfa;
            }
          }
LAB_00105c2e:
          sq_pop(v,1);
          lVar4 = sq_getlocal(v,lVar3,lVar7);
          lVar7 = lVar7 + 1;
        } while (lVar4 != 0);
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != 10);
  }
  return;
}

Assistant:

void sqstd_printcallstack(HSQUIRRELVM v)
{
    SQPRINTFUNCTION pf = sq_geterrorfunc(v);
    if(pf) {
        SQStackInfos si;
        SQInteger i;
        SQFloat f;
        const SQChar *s;
        SQInteger level=1; //1 is to skip this function that is level 0
        const SQChar *name=0;
        SQInteger seq=0;
        pf(v,_SC("\nCALLSTACK\n"));
        while(SQ_SUCCEEDED(sq_stackinfos(v,level,&si)))
        {
            const SQChar *fn=_SC("unknown");
            const SQChar *src=_SC("unknown");
            if(si.funcname)fn=si.funcname;
            if(si.source)src=si.source;
            pf(v,_SC("*FUNCTION [%s()] %s line [%d]\n"),fn,src,si.line);
            level++;
        }
        level=0;
        pf(v,_SC("\nLOCALS\n"));

        for(level=0;level<10;level++){
            seq=0;
            while((name = sq_getlocal(v,level,seq)))
            {
                seq++;
                switch(sq_gettype(v,-1))
                {
                case OT_NULL:
                    pf(v,_SC("[%s] NULL\n"),name);
                    break;
                case OT_INTEGER:
                    sq_getinteger(v,-1,&i);
                    pf(v,_SC("[%s] %d\n"),name,i);
                    break;
                case OT_FLOAT:
                    sq_getfloat(v,-1,&f);
                    pf(v,_SC("[%s] %.14g\n"),name,f);
                    break;
                case OT_USERPOINTER:
                    pf(v,_SC("[%s] USERPOINTER\n"),name);
                    break;
                case OT_STRING:
                    sq_getstring(v,-1,&s);
                    pf(v,_SC("[%s] \"%s\"\n"),name,s);
                    break;
                case OT_TABLE:
                    pf(v,_SC("[%s] TABLE\n"),name);
                    break;
                case OT_ARRAY:
                    pf(v,_SC("[%s] ARRAY\n"),name);
                    break;
                case OT_CLOSURE:
                    pf(v,_SC("[%s] CLOSURE\n"),name);
                    break;
                case OT_NATIVECLOSURE:
                    pf(v,_SC("[%s] NATIVECLOSURE\n"),name);
                    break;
                case OT_GENERATOR:
                    pf(v,_SC("[%s] GENERATOR\n"),name);
                    break;
                case OT_USERDATA:
                    pf(v,_SC("[%s] USERDATA\n"),name);
                    break;
                case OT_THREAD:
                    pf(v,_SC("[%s] THREAD\n"),name);
                    break;
                case OT_CLASS:
                    pf(v,_SC("[%s] CLASS\n"),name);
                    break;
                case OT_INSTANCE:
                    pf(v,_SC("[%s] INSTANCE\n"),name);
                    break;
                case OT_WEAKREF:
                    pf(v,_SC("[%s] WEAKREF\n"),name);
                    break;
                case OT_BOOL:{
                    SQBool bval;
                    sq_getbool(v,-1,&bval);
                    pf(v,_SC("[%s] %s\n"),name,bval == SQTrue ? _SC("true"):_SC("false"));
                             }
                    break;
                default: assert(0); break;
                }
                sq_pop(v,1);
            }
        }
    }
}